

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist.h
# Opt level: O0

int __thiscall
leveldb::SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::GetMaxHeight
          (SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *this)

{
  long in_RDI;
  memory_order __b;
  
  std::operator&(memory_order_relaxed,__memory_order_mask);
  return *(int *)(in_RDI + 0x20);
}

Assistant:

inline int GetMaxHeight() const {
    return max_height_.load(std::memory_order_relaxed);
  }